

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall application::Chat::cleanInput(Chat *this)

{
  int iVar1;
  int iVar2;
  Chat *this_00;
  uint uVar3;
  winsize w;
  undefined1 local_38 [2];
  ushort local_36;
  
  iVar2 = 0;
  ioctl(1,0x5413,local_38);
  iVar1 = (int)((((long)this->promptLastLine_ + (this->input_)._M_string_length) - 1) /
               (ulong)local_36) + this->promptLines_;
  if (0 < iVar1) {
    do {
      std::operator<<((wostream *)&std::wcout,"\r");
      uVar3 = (uint)local_36;
      if (local_36 != 0) {
        do {
          std::operator<<((wostream *)&std::wcout," ");
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      this_00 = (Chat *)&std::wcout;
      std::operator<<((wostream *)&std::wcout,"\r");
      if (iVar2 != this->promptLines_ + -1) {
        moveCursor(this_00,0,1);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < iVar1);
  }
  return;
}

Assistant:

void Chat::cleanInput()
{
	int consoleWidth = getConsoleWidth(),
		lines = promptLines_ + (promptLastLine_ + input_.size() - 1) / consoleWidth;

	for (int j = 0; j < lines; j++)
	{
		std::wcout << "\r";
		for (int i = 0; i < consoleWidth; i++)
			std::wcout << " ";
		std::wcout << "\r";
		if (j != promptLines_ - 1)
		{
#ifdef _WIN32
			moveCursor(0, 2);
#else
			moveCursor(0, 1);
#endif
		}
	}
#ifdef _WIN32
	moveCursor(0, 1);
#endif
}